

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O3

split_helper_index<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
* __thiscall
detail::
split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
::operator[](split_helper_index<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
             *__return_storage_ptr__,
            split_helper<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_false,_false,_true>
            *this,size_t n)

{
  pointer pwVar1;
  
  (__return_storage_ptr__->delim)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->delim).field_2;
  pwVar1 = (this->delim)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)__return_storage_ptr__,pwVar1,pwVar1 + (this->delim)._M_string_length);
  __return_storage_ptr__->index = n;
  return __return_storage_ptr__;
}

Assistant:

split_helper_index<StlString, false, false, true> operator[](size_t n) const noexcept { return{ std::move(delim), n }; }